

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O2

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,char **tokenNames_,int numTokens_,RefAST *node_,int lower,
          int upper_,bool matchNot)

{
  ASTRef *pAVar1;
  AST *pAVar2;
  allocator<char> local_76;
  allocator<char> local_75;
  int local_74;
  string local_70;
  string local_50;
  
  local_74 = upper_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Mismatched Token",&local_75);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<AST>",&local_76);
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_70,&local_50,-1,-1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedTokenException_002bb378;
  (this->token).ref = (TokenRef *)0x0;
  pAVar1 = node_->ref;
  if (pAVar1 != (ASTRef *)0x0) {
    pAVar1->count = pAVar1->count + 1;
  }
  (this->node).ref = pAVar1;
  if ((node_->ref == (ASTRef *)0x0) || (pAVar2 = node_->ref->ptr, pAVar2 == (AST *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&this->tokenText,"<empty tree>",(allocator<char> *)&local_70);
  }
  else {
    (*pAVar2->_vptr_AST[0x18])(&this->tokenText);
  }
  this->mismatchType = matchNot + 3;
  this->expecting = lower;
  this->upper = local_74;
  BitSet::BitSet(&this->set,0x40);
  this->tokenNames = tokenNames_;
  this->numTokens = numTokens_;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const char* const* tokenNames_,
	const int numTokens_,
	RefAST node_,
	int lower,
	int upper_,
	bool matchNot
) : RecognitionException("Mismatched Token","<AST>",-1,-1)
  , token(0)
  , node(node_)
  , tokenText( (node_ ? node_->toString(): ANTLR_USE_NAMESPACE(std)string("<empty tree>")) )
  , mismatchType(matchNot ? NOT_RANGE : RANGE)
  , expecting(lower)
  , upper(upper_)
  , tokenNames(tokenNames_)
  , numTokens(numTokens_)
{
}